

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O3

int main(int argc,char **argv)

{
  char **ppcVar1;
  bool bVar2;
  double dVar3;
  aom_img_fmt_t aVar4;
  _Bool _Var5;
  byte bVar6;
  uint16_t uVar7;
  int iVar8;
  uint uVar9;
  uint block_size;
  uint uVar10;
  int iVar11;
  aom_codec_err_t aVar12;
  aom_image_t *paVar13;
  FILE *__stream;
  uint8_t *flat_blocks;
  FILE *__stream_00;
  FILE *__s;
  ulong uVar14;
  long lVar15;
  long lVar16;
  uchar *puVar17;
  long lVar18;
  aom_img_fmt_t fmt;
  char **argv_00;
  ulong uVar19;
  uchar *puVar20;
  size_t size;
  ulong uVar21;
  char *pcVar22;
  int xi;
  ulong uVar23;
  long lVar24;
  uint d_w;
  long lVar25;
  int c;
  bool bVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  aom_noise_model_params_t params;
  int local_9bc;
  double *local_9b8;
  double *local_9a8;
  double *local_9a0;
  ulong local_988;
  ulong local_978;
  aom_rational local_970;
  uint local_968;
  double *local_960;
  long local_938;
  ulong local_930;
  int strides [3];
  aom_film_grain_table_t grain_table;
  int local_8d8 [2];
  undefined4 local_8d0;
  uchar *local_8c8;
  uchar *puStack_8c0;
  uchar *local_8b8;
  uchar *local_8a8;
  uchar *puStack_8a0;
  uchar *local_898;
  aom_image_t raw;
  aom_flat_block_finder_t block_finder;
  aom_image_t denoised;
  aom_noise_model_t noise_model;
  aom_film_grain_t grain;
  aom_internal_error_info error_info;
  
  exec_name = *argv;
  if (argv[1] == (char *)0x0) {
    fmt = AOM_IMG_FMT_I420;
    local_930 = 0x19;
    local_9bc = 1;
    local_938 = 10000000;
    local_968 = 8;
    block_size = 0x20;
    bVar2 = false;
    uVar14 = 0;
    uVar19 = 0;
    local_9a0 = (double *)0x0;
    local_9a8 = (double *)0x0;
    local_960 = (double *)0x0;
    bVar26 = false;
    local_9b8 = (double *)0x0;
  }
  else {
    argv_00 = argv + 1;
    local_9b8 = (double *)0x0;
    aVar4 = AOM_IMG_FMT_I420;
    block_size = 0x20;
    local_968 = 8;
    local_9bc = 1;
    local_970.num = 0x19;
    local_970.den = 0;
    local_978 = 1;
    iVar11 = 1;
    local_960 = (double *)0x0;
    local_9a8 = (double *)0x0;
    local_9a0 = (double *)0x0;
    uVar19 = 0;
    uVar14 = 0;
    do {
      iVar8 = arg_match((arg *)&noise_model,&help,argv_00);
      if (iVar8 != 0) {
        fwrite("\nOptions:\n",10,1,_stdout);
LAB_00120447:
        arg_show_usage((FILE *)_stdout,(arg_def **)parse_args_main_args);
        exit(0);
      }
      iVar8 = arg_match((arg *)&noise_model,&width_arg,argv_00);
      if (iVar8 == 0) {
        iVar8 = arg_match((arg *)&noise_model,&height_arg,argv_00);
        if (iVar8 == 0) {
          iVar8 = arg_match((arg *)&noise_model,&input_arg,argv_00);
          if (iVar8 == 0) {
            iVar8 = arg_match((arg *)&noise_model,&input_denoised_arg,argv_00);
            if (iVar8 == 0) {
              iVar8 = arg_match((arg *)&noise_model,&output_grain_table_arg,argv_00);
              if (iVar8 == 0) {
                iVar8 = arg_match((arg *)&noise_model,&block_size_arg,argv_00);
                if (iVar8 == 0) {
                  iVar8 = arg_match((arg *)&noise_model,&bit_depth_arg,argv_00);
                  if (iVar8 == 0) {
                    iVar8 = arg_match((arg *)&noise_model,&flat_block_finder_arg,argv_00);
                    if (iVar8 == 0) {
                      iVar8 = arg_match((arg *)&noise_model,&fps_arg,argv_00);
                      if (iVar8 == 0) {
                        iVar8 = arg_match((arg *)&noise_model,&use_i420,argv_00);
                        if (iVar8 == 0) {
                          iVar8 = arg_match((arg *)&noise_model,&use_i422,argv_00);
                          if (iVar8 == 0) {
                            iVar8 = arg_match((arg *)&noise_model,&use_i444,argv_00);
                            if (iVar8 == 0) {
                              iVar8 = arg_match((arg *)&noise_model,&skip_frames_arg,argv_00);
                              if (iVar8 == 0) {
                                iVar8 = arg_match((arg *)&noise_model,&debug_file_arg,argv_00);
                                if (iVar8 == 0) {
                                  fprintf(_stdout,"Unknown arg: %s\n\nUsage:\n",*argv_00);
                                  goto LAB_00120447;
                                }
                                local_9b8 = noise_model.combined_state[0].eqns.A;
                              }
                              else {
                                local_9bc = atoi((char *)noise_model.combined_state[0].eqns.A);
                              }
                            }
                            else {
                              aVar4 = AOM_IMG_FMT_I444;
                            }
                          }
                          else {
                            aVar4 = AOM_IMG_FMT_I422;
                          }
                        }
                        else {
                          aVar4 = AOM_IMG_FMT_I420;
                        }
                      }
                      else {
                        local_970 = arg_parse_rational((arg *)&noise_model);
                        local_978 = (ulong)local_970 >> 0x20;
                      }
                    }
                    else {
                      iVar11 = atoi((char *)noise_model.combined_state[0].eqns.A);
                    }
                  }
                  else {
                    local_968 = atoi((char *)noise_model.combined_state[0].eqns.A);
                  }
                }
                else {
                  block_size = atoi((char *)noise_model.combined_state[0].eqns.A);
                }
              }
              else {
                local_960 = noise_model.combined_state[0].eqns.A;
              }
            }
            else {
              local_9a8 = noise_model.combined_state[0].eqns.A;
            }
          }
          else {
            local_9a0 = noise_model.combined_state[0].eqns.A;
          }
        }
        else {
          uVar9 = atoi((char *)noise_model.combined_state[0].eqns.A);
          uVar19 = (ulong)uVar9;
        }
      }
      else {
        uVar9 = atoi((char *)noise_model.combined_state[0].eqns.A);
        uVar14 = (ulong)uVar9;
      }
      ppcVar1 = argv_00 + 1;
      argv_00 = argv_00 + 1;
    } while (*ppcVar1 != (char *)0x0);
    bVar2 = 8 < (int)local_968;
    fmt = aVar4 | 0x800;
    if ((int)local_968 < 9) {
      fmt = aVar4;
    }
    bVar26 = iVar11 == 0;
    local_930 = (ulong)local_970.num;
    local_938 = (long)(int)local_978 * 10000000;
  }
  uVar9 = (uint)uVar19;
  d_w = (uint)uVar14;
  if (((((uVar14 & 1) != 0) || ((int)d_w < 1)) || ((int)uVar9 < 1)) || ((uVar19 & 1) != 0)) {
    die("Invalid frame size: %dx%d",uVar14,uVar19);
  }
  paVar13 = aom_img_alloc(&raw,fmt,d_w,uVar9,1);
  if ((paVar13 == (aom_image_t *)0x0) ||
     (paVar13 = aom_img_alloc(&denoised,fmt,d_w,uVar9,1), paVar13 == (aom_image_t *)0x0)) {
    pcVar22 = "Failed to allocate image.";
  }
  else {
    __stream = fopen64((char *)local_9a0,"rb");
    if (__stream == (FILE *)0x0) {
      pcVar22 = "Failed to open input file: %s";
LAB_00120481:
      die(pcVar22,local_9a0);
    }
    fprintf(_stderr,"Bit depth: %d  stride:%d\n",(ulong)local_968,(ulong)(uint)raw.stride[0]);
    aom_flat_block_finder_init(&block_finder,block_size,local_968,(uint)bVar2);
    size = (size_t)(((int)(uVar9 + block_size + -1) / (int)block_size) *
                   ((int)(block_size + d_w + -1) / (int)block_size));
    flat_blocks = (uint8_t *)aom_malloc(size);
    if (flat_blocks == (uint8_t *)0x0) {
      pcVar22 = "Failed to allocate block data.";
    }
    else {
      params.use_highbd._0_1_ = bVar2;
      params.bit_depth = local_968;
      params.use_highbd._1_3_ = 0;
      params.shape = '\x01';
      params._1_3_ = 0;
      params.lag = 3;
      aom_noise_model_init(&noise_model,params);
      if (local_9a8 == (double *)0x0) {
        pcVar22 = "--input-denoised file must be specified";
      }
      else {
        __stream_00 = fopen64((char *)local_9a8,"rb");
        if (__stream_00 == (FILE *)0x0) {
          pcVar22 = "Unable to open input_denoised: %s";
          local_9a0 = local_9a8;
          goto LAB_00120481;
        }
        if (local_9b8 == (double *)0x0) {
          __s = (FILE *)0x0;
        }
        else {
          __s = fopen64((char *)local_9b8,"w");
        }
        grain_table.head = (aom_film_grain_table_entry_t *)0x0;
        grain_table.tail = (aom_film_grain_table_entry_t *)0x0;
        _Var5 = aom_img_read(&raw,(FILE *)__stream);
        if (_Var5) {
          dVar3 = (double)(int)(block_size * block_size);
          uVar7 = 0x1cdf;
          uVar19 = 0;
          local_988 = 0;
          do {
            _Var5 = aom_img_read(&denoised,(FILE *)__stream_00);
            if (!_Var5) {
              pcVar22 = "Unable to read input denoised file";
              goto LAB_0012048f;
            }
            if ((int)((long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff) %
                     (long)local_9bc) == 0) {
              memset(flat_blocks,1,size);
              if (!bVar26) {
                memset(flat_blocks,0,size);
                uVar10 = aom_flat_block_finder_run
                                   (&block_finder,raw.planes[0],d_w,uVar9,d_w,flat_blocks);
                fprintf(_stdout,"Num flat blocks %d\n",(ulong)uVar10);
              }
              local_8a8 = raw.planes[0];
              puStack_8a0 = raw.planes[1];
              local_898 = raw.planes[2];
              local_8c8 = denoised.planes[0];
              puStack_8c0 = denoised.planes[1];
              local_8b8 = denoised.planes[2];
              strides[0] = raw.stride[0] >> bVar2;
              strides[1] = raw.stride[1] >> bVar2;
              strides[2] = raw.stride[2] >> bVar2;
              local_8d8[0] = raw.x_chroma_shift;
              local_8d8[1] = raw.y_chroma_shift;
              local_8d0 = 0;
              fwrite("Updating noise model...\n",0x18,1,_stdout);
              bVar6 = aom_noise_model_update
                                (&noise_model,&local_8a8,&local_8c8,d_w,uVar9,strides,local_8d8,
                                 flat_blocks,block_size);
              if (bVar6 == 3) {
                uVar14 = (local_938 * uVar19) / local_930;
                fprintf(_stdout,
                        "Noise type is different, updating parameters for time [ %ld, %ld)\n",
                        local_988,uVar14);
                aom_noise_model_get_grain_parameters(&noise_model,&grain);
                grain.random_seed = uVar7;
                aom_film_grain_table_append(&grain_table,local_988,uVar14,&grain);
                aom_noise_model_save_latest(&noise_model);
                uVar7 = 0;
                local_988 = uVar14;
              }
              if (__s != (FILE *)0x0) {
                fwrite("figure(3); clf;\n",0x10,1,__s);
                fwrite("figure(2); clf;\n",0x10,1,__s);
                fwrite("figure(1); clf;\n",0x10,1,__s);
                uVar14 = 0;
                do {
                  fprintf(__s,"noise_strength_%d = [\n",uVar14 & 0xffffffff);
                  if (0 < noise_model.combined_state[uVar14].strength_solver.eqns.n) {
                    lVar25 = 0;
                    do {
                      fprintf(__s,"%lf ",
                              SUB84(noise_model.combined_state[uVar14].strength_solver.eqns.x
                                    [lVar25],0));
                      lVar25 = lVar25 + 1;
                    } while (lVar25 < noise_model.combined_state[uVar14].strength_solver.eqns.n);
                  }
                  fwrite("];\n",3,1,__s);
                  fprintf(__s,"plot(noise_strength_%d); hold on;\n",uVar14 & 0xffffffff);
                  uVar14 = uVar14 + 1;
                } while (uVar14 != 3);
                fwrite("legend(\'Y\', \'cb\', \'cr\');\n",0x19,1,__s);
                fwrite("title(\'Noise strength function\');\n",0x22,1,__s);
                aom_noise_model_get_grain_parameters(&noise_model,&grain);
                grain.apply_grain = 1;
                grain.random_seed = 0x1cdf;
                grain.bit_depth = raw.bit_depth;
                aom_img_alloc((aom_image_t *)&error_info,raw.fmt,raw.w,raw.h,1);
                iVar11 = av1_add_film_grain(&grain,&denoised,(aom_image_t *)&error_info);
                uVar10 = raw.w;
                if (iVar11 == 0) {
                  uVar14 = (ulong)(raw.h + (block_size - 1)) / (ulong)block_size;
                  fwrite("x = [",5,1,__s);
                  if (0 < (int)uVar14) {
                    iVar11 = 0;
                    uVar10 = (uVar10 + (block_size - 1)) / block_size;
                    local_9b8 = (double *)0x0;
                    do {
                      if (0 < (int)uVar10) {
                        lVar24 = 0;
                        lVar25 = 0;
                        do {
                          if ((int)block_size < 1) {
                            dVar27 = 0.0;
                            dVar31 = 0.0;
                            dVar32 = 0.0;
                            dVar28 = 0.0;
                            dVar30 = 0.0;
                          }
                          else {
                            lVar15 = (long)raw.stride[0];
                            lVar16 = iVar11 * lVar15 + lVar24;
                            lVar18 = error_info.detail._56_8_ + lVar16;
                            puVar20 = denoised.planes[0] + lVar16;
                            puVar17 = raw.planes[0] + lVar16;
                            dVar30 = 0.0;
                            uVar21 = 0;
                            dVar28 = 0.0;
                            dVar32 = 0.0;
                            dVar31 = 0.0;
                            dVar27 = 0.0;
                            do {
                              uVar23 = 0;
                              do {
                                dVar29 = (double)(int)((uint)puVar17[uVar23] - (uint)puVar20[uVar23]
                                                      );
                                dVar27 = dVar27 + dVar29;
                                dVar28 = dVar28 + dVar29 * dVar29;
                                dVar30 = dVar30 + (double)puVar17[uVar23];
                                dVar29 = (double)(int)((uint)*(byte *)(lVar18 + uVar23) -
                                                      (uint)puVar20[uVar23]);
                                dVar32 = dVar32 + dVar29;
                                dVar31 = dVar31 + dVar29 * dVar29;
                                uVar23 = uVar23 + 1;
                              } while (block_size != uVar23);
                              uVar21 = uVar21 + 1;
                              lVar18 = lVar18 + lVar15;
                              puVar20 = puVar20 + lVar15;
                              puVar17 = puVar17 + lVar15;
                            } while (uVar21 != block_size);
                          }
                          dVar28 = dVar28 / dVar3 - (dVar27 / dVar3) * (dVar27 / dVar3);
                          if (dVar28 < 0.0) {
                            dVar28 = sqrt(dVar28);
                          }
                          else {
                            dVar28 = SQRT(dVar28);
                          }
                          dVar27 = dVar31 / dVar3 - (dVar32 / dVar3) * (dVar32 / dVar3);
                          if (dVar27 < 0.0) {
                            dVar27 = sqrt(dVar27);
                          }
                          else {
                            dVar27 = SQRT(dVar27);
                          }
                          fprintf(__s,"%d %3.2lf %3.2lf %3.2lf  ",SUB84(dVar30 / dVar3,0),dVar28,
                                  dVar27,(ulong)flat_blocks
                                                [lVar25 + (long)local_9b8 * (long)(int)uVar10]);
                          lVar25 = lVar25 + 1;
                          lVar24 = lVar24 + (int)block_size;
                        } while (lVar25 < (int)uVar10);
                      }
                      fputc(10,__s);
                      local_9b8 = (double *)((long)local_9b8 + 1);
                      iVar11 = iVar11 + block_size;
                    } while (local_9b8 < uVar14);
                  }
                  fwrite("];\n",3,1,__s);
                  if ((raw.fmt & 0x800) == AOM_IMG_FMT_NONE) {
                    fwrite("figure(2); clf;\n",0x10,1,__s);
                    fwrite("scatter(x(:, 2:4:end), x(:, 3:4:end), \'r\'); hold on;\n",0x35,1,__s);
                    fwrite("scatter(x(:, 2:4:end), x(:, 4:4:end), \'b\');\n",0x2c,1,__s);
                    fwrite("plot(linspace(0, 255, length(noise_strength_0)), noise_strength_0, \'b\');\n"
                           ,0x49,1,__s);
                    fwrite("title(\'Scatter plot of intensity vs noise strength\');\n",0x36,1,__s);
                    fwrite("legend(\'Actual\', \'Estimated\', \'Estimated strength\');\n",0x35,1,__s
                          );
                    fwrite("figure(3); clf;\n",0x10,1,__s);
                    fwrite("scatter(x(:, 3:4:end), x(:, 4:4:end), \'k\');\n",0x2c,1,__s);
                    fwrite("title(\'Actual vs Estimated\');\n",0x1e,1,__s);
                    fwrite("pause(3);\n",10,1,__s);
                  }
                  else {
                    main_cold_2();
                  }
                }
                else {
                  main_cold_1();
                }
                aom_img_free((aom_image_t *)&error_info);
                fflush(__s);
              }
              fprintf(_stdout,"Done noise model update, status = %d\n",(ulong)bVar6);
            }
            uVar19 = uVar19 + 1;
            _Var5 = aom_img_read(&raw,(FILE *)__stream);
          } while (_Var5);
        }
        else {
          uVar7 = 0x1cdf;
          local_988 = 0;
        }
        aom_noise_model_get_grain_parameters(&noise_model,&grain);
        grain.random_seed = uVar7;
        aom_film_grain_table_append(&grain_table,local_988,0x7fffffffffffffff,&grain);
        if ((local_960 == (double *)0x0) ||
           (aVar12 = aom_film_grain_table_write(&grain_table,(char *)local_960,&error_info),
           aVar12 == AOM_CODEC_OK)) {
          aom_film_grain_table_free(&grain_table);
          fclose(__stream);
          fclose(__stream_00);
          if (__s != (FILE *)0x0) {
            fclose(__s);
          }
          aom_img_free(&raw);
          aom_img_free(&denoised);
          return 0;
        }
        pcVar22 = "Unable to write output film grain table";
      }
    }
  }
LAB_0012048f:
  die(pcVar22);
}

Assistant:

int main(int argc, char *argv[]) {
  noise_model_args_t args = { 0,  0, { 25, 1 }, 0, 0, 0,   AOM_IMG_FMT_I420,
                              32, 8, 1,         0, 1, NULL };
  aom_image_t raw, denoised;
  FILE *infile = NULL;
  AvxVideoInfo info;

  memset(&info, 0, sizeof(info));

  (void)argc;
  exec_name = argv[0];
  parse_args(&args, argv + 1);

  info.frame_width = args.width;
  info.frame_height = args.height;
  info.time_base.numerator = args.fps.den;
  info.time_base.denominator = args.fps.num;

  if (info.frame_width <= 0 || info.frame_height <= 0 ||
      (info.frame_width % 2) != 0 || (info.frame_height % 2) != 0) {
    die("Invalid frame size: %dx%d", info.frame_width, info.frame_height);
  }
  if (!aom_img_alloc(&raw, args.img_fmt, info.frame_width, info.frame_height,
                     1)) {
    die("Failed to allocate image.");
  }
  if (!aom_img_alloc(&denoised, args.img_fmt, info.frame_width,
                     info.frame_height, 1)) {
    die("Failed to allocate image.");
  }
  infile = fopen(args.input, "rb");
  if (!infile) {
    die("Failed to open input file: %s", args.input);
  }
  fprintf(stderr, "Bit depth: %d  stride:%d\n", args.bit_depth, raw.stride[0]);

  const int high_bd = args.bit_depth > 8;
  const int block_size = args.block_size;
  aom_flat_block_finder_t block_finder;
  aom_flat_block_finder_init(&block_finder, block_size, args.bit_depth,
                             high_bd);

  const int num_blocks_w = (info.frame_width + block_size - 1) / block_size;
  const int num_blocks_h = (info.frame_height + block_size - 1) / block_size;
  uint8_t *flat_blocks = (uint8_t *)aom_malloc(num_blocks_w * num_blocks_h);
  if (!flat_blocks) die("Failed to allocate block data.");
  // Sets the random seed on the first entry in the output table
  int16_t random_seed = 7391;
  aom_noise_model_t noise_model;
  aom_noise_model_params_t params = { AOM_NOISE_SHAPE_SQUARE, 3, args.bit_depth,
                                      high_bd };
  aom_noise_model_init(&noise_model, params);

  FILE *denoised_file = 0;
  if (args.input_denoised) {
    denoised_file = fopen(args.input_denoised, "rb");
    if (!denoised_file)
      die("Unable to open input_denoised: %s", args.input_denoised);
  } else {
    die("--input-denoised file must be specified");
  }
  FILE *debug_file = 0;
  if (args.debug_file) {
    debug_file = fopen(args.debug_file, "w");
  }
  aom_film_grain_table_t grain_table = { 0, 0 };

  int64_t prev_timestamp = 0;
  int frame_count = 0;
  while (aom_img_read(&raw, infile)) {
    if (args.input_denoised) {
      if (!aom_img_read(&denoised, denoised_file)) {
        die("Unable to read input denoised file");
      }
    }
    if (frame_count % args.skip_frames == 0) {
      int num_flat_blocks = num_blocks_w * num_blocks_h;
      memset(flat_blocks, 1, num_flat_blocks);
      if (args.run_flat_block_finder) {
        memset(flat_blocks, 0, num_flat_blocks);
        num_flat_blocks = aom_flat_block_finder_run(
            &block_finder, raw.planes[0], info.frame_width, info.frame_height,
            info.frame_width, flat_blocks);
        fprintf(stdout, "Num flat blocks %d\n", num_flat_blocks);
      }

      const uint8_t *planes[3] = { raw.planes[0], raw.planes[1],
                                   raw.planes[2] };
      uint8_t *denoised_planes[3] = { denoised.planes[0], denoised.planes[1],
                                      denoised.planes[2] };
      int strides[3] = { raw.stride[0] >> high_bd, raw.stride[1] >> high_bd,
                         raw.stride[2] >> high_bd };
      int chroma_sub[3] = { raw.x_chroma_shift, raw.y_chroma_shift, 0 };

      fprintf(stdout, "Updating noise model...\n");
      aom_noise_status_t status = aom_noise_model_update(
          &noise_model, (const uint8_t *const *)planes,
          (const uint8_t *const *)denoised_planes, info.frame_width,
          info.frame_height, strides, chroma_sub, flat_blocks, block_size);

      int64_t cur_timestamp =
          frame_count * 10000000ULL * args.fps.den / args.fps.num;
      if (status == AOM_NOISE_STATUS_DIFFERENT_NOISE_TYPE) {
        fprintf(stdout,
                "Noise type is different, updating parameters for time "
                "[ %" PRId64 ", %" PRId64 ")\n",
                prev_timestamp, cur_timestamp);
        aom_film_grain_t grain;
        aom_noise_model_get_grain_parameters(&noise_model, &grain);
        grain.random_seed = random_seed;
        random_seed = 0;
        aom_film_grain_table_append(&grain_table, prev_timestamp, cur_timestamp,
                                    &grain);
        aom_noise_model_save_latest(&noise_model);
        prev_timestamp = cur_timestamp;
      }
      if (debug_file) {
        print_debug_info(debug_file, &raw, &denoised, flat_blocks, block_size,
                         &noise_model);
      }
      fprintf(stdout, "Done noise model update, status = %d\n", status);
    }
    frame_count++;
  }

  aom_film_grain_t grain;
  aom_noise_model_get_grain_parameters(&noise_model, &grain);
  grain.random_seed = random_seed;
  aom_film_grain_table_append(&grain_table, prev_timestamp, INT64_MAX, &grain);
  if (args.output_grain_table) {
    struct aom_internal_error_info error_info;
    if (AOM_CODEC_OK != aom_film_grain_table_write(&grain_table,
                                                   args.output_grain_table,
                                                   &error_info)) {
      die("Unable to write output film grain table");
    }
  }
  aom_film_grain_table_free(&grain_table);

  if (infile) fclose(infile);
  if (denoised_file) fclose(denoised_file);
  if (debug_file) fclose(debug_file);
  aom_img_free(&raw);
  aom_img_free(&denoised);

  return EXIT_SUCCESS;
}